

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_features.c
# Opt level: O2

int mbedtls_version_check_feature(char *feature)

{
  int iVar1;
  char **ppcVar2;
  
  iVar1 = -1;
  if (feature != (char *)0x0) {
    ppcVar2 = features;
    do {
      if (*ppcVar2 == (char *)0x0) {
        return -1;
      }
      iVar1 = strcmp(*ppcVar2,feature);
      ppcVar2 = ppcVar2 + 1;
    } while (iVar1 != 0);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mbedtls_version_check_feature( const char *feature )
{
    const char * const *idx = features;

    if( *idx == NULL )
        return( -2 );

    if( feature == NULL )
        return( -1 );

    while( *idx != NULL )
    {
        if( !strcmp( *idx, feature ) )
            return( 0 );
        idx++;
    }
    return( -1 );
}